

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O2

char * get_savestate_path(char *romfile,int number)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char buf [4096];
  
  pcVar2 = realpath(romfile,buf);
  sVar3 = strlen(pcVar2);
  iVar1 = (int)sVar3 + 9;
  if (iVar1 < 0x1000) {
    pcVar2 = (char *)malloc((long)iVar1);
    snprintf(pcVar2,(long)iVar1,"%s.%02d.save",buf,number);
    return pcVar2;
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/gba_system.c",0x35);
  fwrite("Savestate path too long! How deeply are you nesting your directories?\n\x1b[0;m",0x4b,1,
         _stderr);
  exit(1);
}

Assistant:

const char* get_savestate_path(const char* romfile, int number) {
    char buf[PATH_MAX];
    char* rom_path = portable_realpath(romfile, buf);
    int savestate_path_buf_size = strlen(rom_path) + 9; // .xx.save + null terminator

    if (savestate_path_buf_size >= PATH_MAX) {
        logfatal("Savestate path too long! How deeply are you nesting your directories?")
    }

    char* savestate_path = malloc(savestate_path_buf_size);
    snprintf(savestate_path, savestate_path_buf_size, "%s.%02d.save", buf, number);
    return savestate_path;
}